

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

int32_t internal_exr_compute_chunk_offset_size(_internal_exr_part *curpart)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  exr_attr_chlist_t *peVar4;
  exr_attr_tiledesc_t *peVar5;
  exr_attr_chlist_entry_t *peVar6;
  bool bVar7;
  ulong uVar8;
  int32_t iVar9;
  byte bVar10;
  int32_t iVar11;
  ulong uVar12;
  uint64_t uVar13;
  long lVar14;
  int16_t iVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  
  peVar4 = (curpart->channels->field_6).chlist;
  if (curpart->tiles != (exr_attribute_t *)0x0) {
    peVar5 = (curpart->tiles->field_6).tiledesc;
    bVar10 = peVar5->level_and_round & 0xf;
    iVar9 = 0;
    if (bVar10 < 2) {
      iVar9 = 0;
      if ((long)curpart->num_tile_levels_x < 1) {
        lVar14 = 0;
      }
      else {
        lVar16 = 0;
        lVar14 = 0;
        do {
          lVar14 = lVar14 + (long)curpart->tile_level_tile_count_y[lVar16] *
                            (long)curpart->tile_level_tile_count_x[lVar16];
          lVar16 = lVar16 + 1;
        } while (curpart->num_tile_levels_x != lVar16);
      }
      bVar7 = false;
      if (0x7fffffff < lVar14) goto joined_r0x0011dc50;
    }
    else {
      bVar7 = false;
      if (bVar10 != 2) goto joined_r0x0011dc50;
      uVar17 = (ulong)curpart->num_tile_levels_x;
      iVar9 = 0;
      bVar19 = 0 < (long)uVar17;
      if ((long)uVar17 < 1) {
        lVar14 = 0;
      }
      else {
        uVar1 = curpart->num_tile_levels_y;
        lVar16 = (long)(int)uVar1;
        uVar18 = 0;
        lVar14 = 0;
        do {
          bVar7 = 0 < lVar16;
          if (0 < (int)uVar1) {
            lVar14 = (long)*curpart->tile_level_tile_count_y *
                     (long)curpart->tile_level_tile_count_x[uVar18] + lVar14;
            if (lVar14 < 0x80000000) {
              uVar8 = 1;
              do {
                uVar12 = uVar8;
                if (uVar1 == uVar12) break;
                lVar14 = lVar14 + (long)curpart->tile_level_tile_count_y[uVar12] *
                                  (long)curpart->tile_level_tile_count_x[uVar18];
                uVar8 = uVar12 + 1;
              } while (lVar14 < 0x80000000);
              bVar7 = (long)uVar12 < lVar16;
            }
          }
          if (bVar7) break;
          uVar18 = uVar18 + 1;
          bVar19 = uVar18 < uVar17;
        } while (uVar18 != uVar17);
      }
      bVar7 = false;
      if (bVar19) goto joined_r0x0011dc50;
    }
    iVar15 = 0;
    if ((long)peVar4->num_channels < 1) {
      uVar13 = 0;
    }
    else {
      peVar6 = peVar4->entries;
      lVar16 = 0;
      uVar13 = 0;
      iVar15 = 0;
      do {
        uVar17 = (ulong)*(int *)(peVar6->reserved + lVar16 + 7);
        if (uVar17 < 2) {
          uVar17 = (ulong)peVar5->y_size;
        }
        else {
          uVar17 = ((peVar5->y_size + uVar17) - 1) / uVar17;
          iVar15 = 1;
        }
        uVar13 = uVar13 + uVar17 * ((((long)*(int *)(peVar6->reserved + lVar16 + 3) +
                                     (ulong)peVar5->x_size) - 1) /
                                    (ulong)(long)*(int *)(peVar6->reserved + lVar16 + 3) <<
                                   (2U - (*(int *)(peVar6->reserved + lVar16 + -5) == 1) & 0x3f));
        lVar16 = lVar16 + 0x20;
      } while ((long)peVar4->num_channels * 0x20 != lVar16);
    }
    curpart->unpacked_size_per_chunk = uVar13;
    curpart->chan_has_line_sampling = iVar15;
    bVar7 = true;
    iVar9 = (int32_t)lVar14;
    goto joined_r0x0011dc50;
  }
  switch(curpart->comp_type) {
  case EXR_COMPRESSION_NONE:
  case EXR_COMPRESSION_RLE:
  case EXR_COMPRESSION_ZIPS:
    uVar17 = 1;
    bVar7 = true;
    goto LAB_0011db67;
  case EXR_COMPRESSION_ZIP:
  case EXR_COMPRESSION_PXR24:
    uVar17 = 0x10;
    break;
  case EXR_COMPRESSION_PIZ:
  case EXR_COMPRESSION_B44:
  case EXR_COMPRESSION_B44A:
  case EXR_COMPRESSION_DWAA:
    uVar17 = 0x20;
    break;
  case EXR_COMPRESSION_DWAB:
    uVar17 = 0x100;
    break;
  default:
    bVar7 = false;
    iVar9 = 0;
    goto joined_r0x0011dc50;
  }
  bVar7 = false;
LAB_0011db67:
  iVar2 = (curpart->data_window).min.field_0.field_0.y;
  iVar3 = (curpart->data_window).max.field_0.field_0.y;
  iVar15 = 0;
  if ((long)peVar4->num_channels < 1) {
    uVar13 = 0;
  }
  else {
    peVar6 = peVar4->entries;
    lVar14 = 0;
    uVar13 = 0;
    iVar15 = 0;
    do {
      uVar18 = (ulong)*(int *)(peVar6->reserved + lVar14 + 7);
      lVar16 = ((((long)(curpart->data_window).max.field_0.field_0.x -
                 (long)(curpart->data_window).min.field_0.field_0.x) + 1U) /
                (ulong)(long)*(int *)(peVar6->reserved + lVar14 + 3) <<
               (2U - (*(int *)(peVar6->reserved + lVar14 + -5) == 1) & 0x3f)) * uVar17;
      if (1 < uVar18) {
        iVar15 = 1;
      }
      if (1 < uVar18 && !bVar7) {
        lVar16 = lVar16 * (uVar17 / uVar18);
        iVar15 = 1;
      }
      uVar13 = uVar13 + lVar16;
      lVar14 = lVar14 + 0x20;
    } while ((long)peVar4->num_channels * 0x20 != lVar14);
  }
  curpart->unpacked_size_per_chunk = uVar13;
  curpart->lines_per_chunk = (int16_t)uVar17;
  curpart->chan_has_line_sampling = iVar15;
  iVar9 = (int32_t)((((long)iVar3 - (long)iVar2) + uVar17) / uVar17);
  bVar7 = true;
joined_r0x0011dc50:
  iVar11 = -1;
  if (bVar7) {
    iVar11 = iVar9;
  }
  return iVar11;
}

Assistant:

int32_t
internal_exr_compute_chunk_offset_size (struct _internal_exr_part* curpart)
{
    int32_t                  retval       = 0;
    const exr_attr_box2i_t   dw           = curpart->data_window;
    const exr_attr_chlist_t* channels     = curpart->channels->chlist;
    uint64_t                 unpackedsize = 0;
    uint64_t                 w;
    int                      hasLineSample = 0;

    w = (uint64_t) (((int64_t) dw.max.x) - ((int64_t) dw.min.x) + 1);

    if (curpart->tiles)
    {
        const exr_attr_tiledesc_t* tiledesc  = curpart->tiles->tiledesc;
        int64_t                    tilecount = 0;

        switch (EXR_GET_TILE_LEVEL_MODE ((*tiledesc)))
        {
            case EXR_TILE_ONE_LEVEL:
            case EXR_TILE_MIPMAP_LEVELS:
                for (int32_t l = 0; l < curpart->num_tile_levels_x; ++l)
                    tilecount +=
                        ((int64_t) curpart->tile_level_tile_count_x[l] *
                         (int64_t) curpart->tile_level_tile_count_y[l]);
                if (tilecount > (int64_t) INT_MAX) return -1;
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_RIPMAP_LEVELS:
                for (int32_t lx = 0; lx < curpart->num_tile_levels_x; ++lx)
                {
                    for (int32_t ly = 0; ly < curpart->num_tile_levels_y; ++ly)
                    {
                        tilecount +=
                            ((int64_t) curpart->tile_level_tile_count_x[lx] *
                             (int64_t) curpart->tile_level_tile_count_y[ly]);

                        if (tilecount > (int64_t) INT_MAX) return -1;
                    }
                }
                retval = (int32_t) tilecount;
                break;
            case EXR_TILE_LAST_TYPE:
            default: return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            uint64_t xsamp  = (uint64_t) channels->entries[c].x_sampling;
            uint64_t ysamp  = (uint64_t) channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= (((uint64_t) tiledesc->x_size + xsamp - 1) / xsamp);
            if (ysamp > 1)
            {
                hasLineSample = 1;
                cunpsz *= (((uint64_t) tiledesc->y_size + ysamp - 1) / ysamp);
            }
            else
                cunpsz *= (uint64_t) tiledesc->y_size;
            unpackedsize += cunpsz;
        }
        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);
    }
    else
    {
        uint64_t linePerChunk, h;
        switch (curpart->comp_type)
        {
            case EXR_COMPRESSION_NONE:
            case EXR_COMPRESSION_RLE:
            case EXR_COMPRESSION_ZIPS: linePerChunk = 1; break;
            case EXR_COMPRESSION_ZIP:
            case EXR_COMPRESSION_PXR24: linePerChunk = 16; break;
            case EXR_COMPRESSION_PIZ:
            case EXR_COMPRESSION_B44:
            case EXR_COMPRESSION_B44A:
            case EXR_COMPRESSION_DWAA: linePerChunk = 32; break;
            case EXR_COMPRESSION_DWAB: linePerChunk = 256; break;
            case EXR_COMPRESSION_LAST_TYPE:
            default:
                /* ERROR CONDITION */
                return -1;
        }

        for (int c = 0; c < channels->num_channels; ++c)
        {
            uint64_t xsamp  = (uint64_t) channels->entries[c].x_sampling;
            uint64_t ysamp  = (uint64_t) channels->entries[c].y_sampling;
            uint64_t cunpsz = 0;
            if (channels->entries[c].pixel_type == EXR_PIXEL_HALF)
                cunpsz = 2;
            else
                cunpsz = 4;
            cunpsz *= w / xsamp;
            cunpsz *= linePerChunk;
            if (ysamp > 1)
            {
                hasLineSample = 1;
                if (linePerChunk > 1) cunpsz *= linePerChunk / ysamp;
            }
            unpackedsize += cunpsz;
        }

        curpart->unpacked_size_per_chunk = unpackedsize;
        curpart->lines_per_chunk         = ((int16_t) linePerChunk);
        curpart->chan_has_line_sampling  = ((int16_t) hasLineSample);

        h      = (uint64_t) ((int64_t) dw.max.y - (int64_t) dw.min.y + 1);
        retval = (int32_t) ((h + linePerChunk - 1) / linePerChunk);
    }
    return retval;
}